

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panic.c
# Opt level: O1

void panic(char *str,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list the_args;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_d8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &the_args[0].overflow_arg_area;
  local_e8 = 0x3000000008;
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (panicking == '\0') {
    panicking = panicking + '\x01';
    fputs(" ERROR:  ",_stderr);
    vfprintf(_stderr,str,&local_e8);
    fflush(_stderr);
    exit(1);
  }
  panicking = panicking + '\x01';
  abort();
}

Assistant:

void panic (char *str, ...)
{
	va_list the_args;
	va_start(the_args, str);
	if (panicking++)
	    abort();    /* avoid loops - this should never happen*/

	fputs(" ERROR:  ", stderr);
	vfprintf(stderr, str, the_args);
	fflush(stderr);

	va_end(the_args);
	exit(EXIT_FAILURE);		/* redundant */
	return;
}